

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool __thiscall ghc::filesystem::path::has_relative_path(path *this)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  size_type rootPathLen;
  path *this_local;
  
  sVar2 = root_name_length(this);
  bVar1 = has_root_directory(this);
  uVar3 = std::__cxx11::string::length();
  return sVar2 + (long)(int)(uint)bVar1 < uVar3;
}

Assistant:

GHC_INLINE bool path::has_relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return rootPathLen < _path.length();
}